

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbeddedFunctions.cpp
# Opt level: O2

bool Refal2::embeddedProut(CExecutionContext *executionContext)

{
  __shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2> local_40;
  CProgramPrintHelper local_30;
  
  std::__shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(executionContext->Program).
              super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>);
  CProgramPrintHelper::CProgramPrintHelper(&local_30,(CProgramPtr *)&local_40);
  CUnitList::StrangePrint
            (&executionContext->Argument,(ostream *)&std::cout,&local_30.super_CPrintHelper);
  CProgramPrintHelper::~CProgramPrintHelper(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  CNodeList<Refal2::CUnit>::Empty((CNodeList<Refal2::CUnit> *)executionContext);
  return true;
}

Assistant:

static bool embeddedProut( CExecutionContext& executionContext )
{
	DEBUG_PRINT( __FUNCTION__ )
	executionContext.Argument.StrangePrint( std::cout,
		CProgramPrintHelper( executionContext.Program ) );
	std::cout << std::endl;
	executionContext.Argument.Empty();
	return true;
}